

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

void __thiscall
booster::aio::stream_socket::async_connect(stream_socket *this,endpoint *ep,event_handler *h)

{
  bool bVar1;
  stream_socket *_s;
  socklen_t in_ECX;
  int in_ESI;
  stream_socket *in_RDI;
  pointer connector;
  error_code e;
  pointer in_stack_ffffffffffffff88;
  error_code *in_stack_ffffffffffffff90;
  basic_io_device *this_00;
  unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
  *ptr;
  basic_io_device *in_stack_ffffffffffffffa0;
  _Head_base<0UL,_booster::aio::(anonymous_namespace)::async_connector_*,_false>
  in_stack_ffffffffffffffb0;
  undefined1 local_30 [32];
  int local_10;
  
  local_10 = in_ESI;
  bVar1 = basic_io_device::dont_block
                    ((basic_io_device *)in_RDI,(event_handler *)in_stack_ffffffffffffffa0);
  if (bVar1) {
    std::error_code::error_code(in_stack_ffffffffffffff90);
    connect(in_RDI,local_10,(sockaddr *)(local_30 + 8),in_ECX);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)(local_30 + 8));
    if ((bVar1) && (bVar1 = basic_io_device::would_block(in_stack_ffffffffffffff90), bVar1)) {
      _s = (stream_socket *)operator_new(0x20);
      anon_unknown_15::async_connector::async_connector
                (in_stack_ffffffffffffffb0._M_head_impl,(event_handler *)in_RDI,_s);
      this_00 = (basic_io_device *)local_30;
      std::
      unique_ptr<booster::aio::(anonymous_namespace)::async_connector,std::default_delete<booster::aio::(anonymous_namespace)::async_connector>>
      ::unique_ptr<std::default_delete<booster::aio::(anonymous_namespace)::async_connector>,void>
                ((unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
                  *)this_00,in_stack_ffffffffffffff88);
      ptr = (unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
             *)&stack0xffffffffffffffb0;
      std::
      unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
      ::unique_ptr((unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
                    *)this_00,
                   (unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
                    *)in_stack_ffffffffffffff88);
      callback<void_(const_std::error_code_&)>::
      callback<booster::aio::(anonymous_namespace)::async_connector>
                ((callback<void_(const_std::error_code_&)> *)_s,ptr);
      basic_io_device::on_writeable(this_00,(event_handler *)in_stack_ffffffffffffff88);
      callback<void_(const_std::error_code_&)>::~callback
                ((callback<void_(const_std::error_code_&)> *)0x21aa2e);
      std::
      unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
      ::~unique_ptr((unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
                     *)this_00);
      std::
      unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
      ::~unique_ptr((unique_ptr<booster::aio::(anonymous_namespace)::async_connector,_std::default_delete<booster::aio::(anonymous_namespace)::async_connector>_>
                     *)this_00);
    }
    else {
      basic_io_device::get_io_service(in_stack_ffffffffffffffa0);
      io_service::post((io_service *)in_stack_ffffffffffffff90,
                       (event_handler *)in_stack_ffffffffffffff88,(error_code *)0x21aab8);
    }
  }
  return;
}

Assistant:

void stream_socket::async_connect(endpoint const &ep,event_handler const &h)
{
	if(!dont_block(h))
		return;
	system::error_code e;
	connect(ep,e);
	if(e && would_block(e)) {
		async_connector::pointer connector(new async_connector(h,this));
		on_writeable(std::move(connector));
	}
	else {
		get_io_service().post(h,e);
	}
}